

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
          (ValueFunctionDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *p,
          JointPolicyDiscretePure *jp)

{
  size_t sVar1;
  allocator_type local_23;
  key_equal local_22;
  hasher local_21;
  
  (this->super_ValueFunction)._vptr_ValueFunction =
       (_func_int **)&PTR__ValueFunctionDecPOMDPDiscrete_005d8b88;
  boost::unordered::
  unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::unordered_map(&this->_m_cache,0xb,&local_21,&local_22,&local_23);
  this->_m_planningUnitDecPOMDPDiscrete = p;
  this->_m_jointPolicyDiscretePure = jp;
  this->_m_pu = p;
  this->_m_jpol = jp;
  this->_m_nrJOH = (p->super_PlanningUnitMADPDiscrete)._m_nrJointObservationHistories;
  sVar1 = (**(code **)((long)*(p->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  this->_m_nrJO = sVar1;
  sVar1 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  this->_m_nrS = sVar1;
  this->_m_h = (this->_m_pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  return;
}

Assistant:

ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete(
    PlanningUnitDecPOMDPDiscrete* p , JointPolicyDiscretePure* jp):
    _m_planningUnitDecPOMDPDiscrete(p), //BAS is never used, _m_pu used instead
    _m_jointPolicyDiscretePure(jp)
{
    _m_pu = p;
    _m_jpol = jp;
    _m_nrJOH = _m_pu->GetNrJointObservationHistories();
    _m_nrJO = _m_pu->GetNrJointObservations();
    _m_nrS =  _m_pu->GetNrStates();
    _m_h = _m_pu->GetHorizon();

}